

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxparmultpr.hpp
# Opt level: O2

int __thiscall soplex::SPxParMultPR<double>::selectLeave(SPxParMultPR<double> *this)

{
  double dVar1;
  SPxSolverBase<double> *pSVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  double dVar6;
  
  pSVar2 = (this->super_SPxPricer<double>).thesolver;
  uVar5 = (pSVar2->thecovectors->set).thenum;
  dVar1 = -(this->super_SPxPricer<double>).thetolerance;
  uVar3 = 0xffffffff;
  while (uVar4 = uVar3, dVar6 = dVar1, 0 < (int)uVar5) {
    uVar5 = uVar5 - 1;
    dVar1 = (pSVar2->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5];
    uVar3 = uVar5;
    if (dVar6 <= dVar1) {
      dVar1 = dVar6;
      uVar3 = uVar4;
    }
  }
  return uVar4;
}

Assistant:

int SPxParMultPR<R>::selectLeave()
{
   int i, n;
   R x;
   R best = -this->thetolerance;
   //    const R* up  = this->thesolver->ubBound();
   //    const R* low = this->thesolver->lbBound();

   assert(this->thesolver != nullptr);
   n = -1;

   for(i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = this->thesolver->fTest()[i];

      // x *= EQ_PREF * (1 + (up[i] == low[i]));
      if(x < best)
      {
         n = i;
         best = this->thesolver->fTest()[i];
      }
   }

   return n;
}